

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_resample.c
# Opt level: O0

void resampleto_dsp(t_resample *x,t_sample *out,int insize,int outsize,int method)

{
  t_sample *ptVar1;
  t_sample *buf;
  int method_local;
  int outsize_local;
  int insize_local;
  t_sample *out_local;
  t_resample *x_local;
  
  if (insize == outsize) {
    if (x->s_n != 0) {
      freebytes(x->s_vec,(long)x->s_n << 2);
    }
    x->s_n = 0;
    x->s_vec = out;
  }
  else {
    if (x->s_n != insize) {
      freebytes(x->s_vec,(long)x->s_n << 2);
      ptVar1 = (t_sample *)getbytes((long)insize << 2);
      x->s_vec = ptVar1;
      x->s_n = insize;
    }
    resample_dsp(x,x->s_vec,x->s_n,out,outsize,method);
  }
  return;
}

Assistant:

void resampleto_dsp(t_resample *x,
                         t_sample *out,
                         int insize, int outsize, int method)
{
  if (insize==outsize) {
    if (x->s_n)t_freebytes(x->s_vec, x->s_n * sizeof(*x->s_vec));
    x->s_n = 0;
    x->s_vec = out;
    return;
  }

  if (x->s_n != insize) {
    t_sample *buf=x->s_vec;
    t_freebytes(buf, x->s_n * sizeof(*buf));
    buf = (t_sample *)t_getbytes(insize * sizeof(*buf));
    x->s_vec = buf;
    x->s_n   = insize;
  }

  resample_dsp(x, x->s_vec, x->s_n, out, outsize, method);

  return;
}